

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O0

bool __thiscall nuraft::raft_server::request_leadership(raft_server *this)

{
  bool bVar1;
  __int_type_conflict2 _Var2;
  int iVar3;
  element_type *peVar4;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> this_00;
  custom_notification_msg *this_01;
  element_type *peVar5;
  long lVar6;
  unsigned_long *args_5;
  element_type *this_02;
  uint *puVar7;
  long in_RDI;
  ptr<log_entry> custom_noti_le;
  ptr<custom_notification_msg> custom_noti;
  ptr<req_msg> req;
  ptr<peer> pp;
  iterator entry;
  unique_lock<std::recursive_mutex> guard;
  memory_order __b_1;
  memory_order __b_2;
  memory_order __b;
  raft_server *in_stack_fffffffffffffd68;
  shared_ptr<nuraft::peer> *args;
  unique_lock<std::recursive_mutex> *in_stack_fffffffffffffd70;
  value_type *in_stack_fffffffffffffd78;
  vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
  *in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd8c;
  msg_type *in_stack_fffffffffffffd90;
  unsigned_long *in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffdb8;
  string local_1b8 [55];
  undefined1 local_181;
  ulong in_stack_fffffffffffffe80;
  raft_server *in_stack_fffffffffffffe88;
  undefined1 local_140 [8];
  shared_ptr<nuraft::peer> local_138;
  undefined4 local_124;
  ulong local_120;
  undefined4 local_f4;
  string local_f0 [8];
  rpc_handler *in_stack_ffffffffffffff18;
  ptr<req_msg> *in_stack_ffffffffffffff20;
  ptr<peer> *in_stack_ffffffffffffff28;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_c0 [3];
  string local_a8 [48];
  string local_78 [47];
  byte local_49;
  mutex_type *local_48;
  memory_order local_40;
  int local_3c;
  unsigned_long *local_38;
  uint local_2c;
  memory_order local_28;
  int local_24;
  uint *local_20;
  uint local_14;
  memory_order local_10;
  int local_c;
  uint *local_8;
  
  iVar3 = *(int *)(in_RDI + 0x38);
  _Var2 = std::__atomic_base::operator_cast_to_int((__atomic_base<int> *)in_stack_fffffffffffffd78);
  if ((iVar3 == _Var2) || (bVar1 = is_leader(in_stack_fffffffffffffd68), bVar1)) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    if (bVar1) {
      peVar4 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x27aad6);
      iVar3 = (**(code **)(*(long *)peVar4 + 0x38))();
      if (1 < iVar3) {
        peVar4 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x27aafc);
        msg_if_given_abi_cxx11_
                  ((char *)local_78,"cannot request leadership: this server is already a leader");
        (**(code **)(*(long *)peVar4 + 0x40))
                  (peVar4,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                   ,"request_leadership",0x4fa,local_78);
        std::__cxx11::string::~string(local_78);
      }
    }
    local_49 = 0;
  }
  else {
    _Var2 = std::__atomic_base::operator_cast_to_int
                      ((__atomic_base<int> *)in_stack_fffffffffffffd78);
    if (_Var2 == -1) {
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar1) {
        peVar4 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x27abe3);
        iVar3 = (**(code **)(*(long *)peVar4 + 0x38))();
        if (1 < iVar3) {
          peVar4 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x27ac09);
          msg_if_given_abi_cxx11_((char *)local_a8,"cannot request leadership: cannot find leader");
          (**(code **)(*(long *)peVar4 + 0x40))
                    (peVar4,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                     ,"request_leadership",0x4fe,local_a8);
          std::__cxx11::string::~string(local_a8);
        }
      }
      local_49 = 0;
    }
    else {
      std::unique_lock<std::recursive_mutex>::unique_lock
                (in_stack_fffffffffffffd70,(mutex_type *)in_stack_fffffffffffffd68);
      std::__atomic_base::operator_cast_to_int((__atomic_base<int> *)in_stack_fffffffffffffd78);
      local_c0[0]._M_cur =
           (__node_type *)
           std::
           unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
           ::find((unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
                   *)in_stack_fffffffffffffd68,(key_type *)0x27acff);
      this_00._M_cur =
           (__node_type *)
           std::
           unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
           ::end((unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
                  *)in_stack_fffffffffffffd68);
      bVar1 = std::__detail::operator==
                        (local_c0,(_Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                                   *)&stack0xffffffffffffff30);
      if (bVar1) {
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
        if (bVar1) {
          peVar4 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x27ad84);
          iVar3 = (**(code **)(*(long *)peVar4 + 0x38))();
          if (1 < iVar3) {
            peVar4 = std::
                     __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x27adbd);
            puVar7 = (uint *)(in_RDI + 0x34);
            local_c = 5;
            local_8 = puVar7;
            local_10 = std::operator&(memory_order_seq_cst,__memory_order_mask);
            if (local_c - 1U < 2) {
              local_14 = *puVar7;
            }
            else if (local_c == 5) {
              local_14 = *puVar7;
            }
            else {
              local_14 = *puVar7;
            }
            msg_if_given_abi_cxx11_
                      ((char *)local_f0,
                       "cannot request leadership: cannot find peer for leader id %d",
                       (ulong)local_14);
            (**(code **)(*(long *)peVar4 + 0x40))
                      (peVar4,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                       ,"request_leadership",0x506,local_f0);
            std::__cxx11::string::~string(local_f0);
          }
        }
        local_49 = 0;
        local_f4 = 1;
      }
      else {
        std::__detail::
        _Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::
        operator->((_Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                    *)0x27af31);
        std::shared_ptr<nuraft::peer>::shared_ptr
                  ((shared_ptr<nuraft::peer> *)in_stack_fffffffffffffd70,
                   (shared_ptr<nuraft::peer> *)in_stack_fffffffffffffd68);
        std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x27af59);
        local_120 = srv_state::get_term((srv_state *)0x27af61);
        local_124 = 0x1c;
        this_01 = (custom_notification_msg *)(in_RDI + 0x34);
        peVar5 = std::
                 __shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x27afb2);
        (**(code **)(*(long *)peVar5 + 0x10))();
        local_138.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             term_for_log(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
        peVar5 = std::
                 __shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x27b002);
        lVar6 = (**(code **)(*(long *)peVar5 + 0x10))();
        local_138.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)(lVar6 + -1);
        args_5 = (unsigned_long *)(in_RDI + 0xa0);
        local_3c = 5;
        local_38 = args_5;
        local_40 = std::operator&(memory_order_seq_cst,__memory_order_mask);
        if (local_3c - 1U < 2) {
          local_48 = (mutex_type *)*args_5;
        }
        else if (local_3c == 5) {
          local_48 = (mutex_type *)*args_5;
        }
        else {
          local_48 = (mutex_type *)*args_5;
        }
        local_140 = (undefined1  [8])local_48;
        in_stack_fffffffffffffd70 = (unique_lock<std::recursive_mutex> *)local_140;
        args = &local_138;
        cs_new<nuraft::req_msg,unsigned_long,nuraft::msg_type,int&,std::atomic<int>&,unsigned_long,unsigned_long,unsigned_long>
                  (in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
                   (int *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                   (atomic<int> *)in_stack_fffffffffffffd80,
                   (unsigned_long *)in_stack_fffffffffffffd78,args_5,
                   (unsigned_long *)CONCAT44(local_3c,in_stack_fffffffffffffdb8));
        cs_new<nuraft::custom_notification_msg,nuraft::custom_notification_msg::type>((type *)args);
        std::
        __shared_ptr_access<nuraft::custom_notification_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<nuraft::custom_notification_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x27b153);
        custom_notification_msg::serialize(this_01);
        local_181 = 0xe7;
        cs_new<nuraft::log_entry,int,std::shared_ptr<nuraft::buffer>,nuraft::log_val_type>
                  ((int *)in_stack_fffffffffffffd78,
                   (shared_ptr<nuraft::buffer> *)in_stack_fffffffffffffd70,(log_val_type *)args);
        std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x27b1a1);
        this_02 = std::
                  __shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x27b1ae);
        req_msg::log_entries(this_02);
        std::
        vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
        ::push_back(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
        std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x27b1e3);
        std::shared_ptr<nuraft::peer>::shared_ptr
                  ((shared_ptr<nuraft::peer> *)in_stack_fffffffffffffd70,args);
        peer::send_req((peer *)this_00._M_cur,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                       in_stack_ffffffffffffff18);
        std::shared_ptr<nuraft::peer>::~shared_ptr((shared_ptr<nuraft::peer> *)0x27b234);
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
        if (bVar1) {
          peVar4 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x27b265);
          iVar3 = (**(code **)(*(long *)peVar4 + 0x38))();
          if (3 < iVar3) {
            peVar4 = std::
                     __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x27b298);
            puVar7 = (uint *)(in_RDI + 0x34);
            local_24 = 5;
            local_20 = puVar7;
            local_28 = std::operator&(memory_order_seq_cst,__memory_order_mask);
            if (local_24 - 1U < 2) {
              local_2c = *puVar7;
            }
            else if (local_24 == 5) {
              local_2c = *puVar7;
            }
            else {
              local_2c = *puVar7;
            }
            msg_if_given_abi_cxx11_
                      ((char *)local_1b8,"sent leadership request to leader %d",(ulong)local_2c);
            (**(code **)(*(long *)peVar4 + 0x40))
                      (peVar4,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                       ,"request_leadership",0x51f,local_1b8);
            std::__cxx11::string::~string(local_1b8);
          }
        }
        local_49 = 1;
        local_f4 = 1;
        std::shared_ptr<nuraft::log_entry>::~shared_ptr((shared_ptr<nuraft::log_entry> *)0x27b483);
        std::shared_ptr<nuraft::custom_notification_msg>::~shared_ptr
                  ((shared_ptr<nuraft::custom_notification_msg> *)0x27b490);
        std::shared_ptr<nuraft::req_msg>::~shared_ptr((shared_ptr<nuraft::req_msg> *)0x27b49d);
        std::shared_ptr<nuraft::peer>::~shared_ptr((shared_ptr<nuraft::peer> *)0x27b4aa);
      }
      std::unique_lock<std::recursive_mutex>::~unique_lock(in_stack_fffffffffffffd70);
    }
  }
  return (bool)(local_49 & 1);
}

Assistant:

bool raft_server::request_leadership() {
    // If this server is already a leader, do nothing.
    if (id_ == leader_ || is_leader()) {
        p_er("cannot request leadership: this server is already a leader");
        return false;
    }
    if (leader_ == -1) {
        p_er("cannot request leadership: cannot find leader");
        return false;
    }

    recur_lock(lock_);
    auto entry = peers_.find(leader_);
    if (entry == peers_.end()) {
        p_er("cannot request leadership: cannot find peer for "
             "leader id %d", leader_.load());
        return false;
    }
    ptr<peer> pp = entry->second;

    // Send resignation message to the follower.
    ptr<req_msg> req = cs_new<req_msg>
                       ( state_->get_term(),
                         msg_type::custom_notification_request,
                         id_, leader_,
                         term_for_log(log_store_->next_slot() - 1),
                         log_store_->next_slot() - 1,
                         quick_commit_index_.load() );

    // Create a notification.
    ptr<custom_notification_msg> custom_noti =
        cs_new<custom_notification_msg>
        ( custom_notification_msg::request_resignation );

    // Wrap it using log_entry.
    ptr<log_entry> custom_noti_le =
        cs_new<log_entry>(0, custom_noti->serialize(), log_val_type::custom);

    req->log_entries().push_back(custom_noti_le);
    pp->send_req(pp, req, resp_handler_);
    p_in("sent leadership request to leader %d", leader_.load());
    return true;
}